

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
emplace_back<slang::IntervalMapDetails::NodeRef_const&>
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,NodeRef *args)

{
  pointer pNVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pNVar4;
  pointer pNVar5;
  uintptr_t *puVar6;
  pointer pNVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  pointer pNVar10;
  
  pNVar1 = this->data_;
  pNVar10 = pNVar1 + this->len;
  if (this->len != this->cap) {
    (pNVar10->pip).value = (args->pip).value;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return pNVar1 + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar3 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar3 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    pEVar8 = (EVP_PKEY_CTX *)0xfffffffffffffff;
  }
  lVar9 = (long)pNVar10 - (long)this->data_;
  pNVar4 = (pointer)operator_new((long)pEVar8 * 8);
  *(uintptr_t *)((long)pNVar4 + lVar9) = (args->pip).value;
  pNVar7 = this->data_;
  pNVar1 = pNVar7 + this->len;
  pNVar5 = pNVar4;
  if (pNVar1 == pNVar10) {
    for (; pNVar7 != pNVar10; pNVar7 = pNVar7 + 1) {
      (pNVar5->pip).value = (pNVar7->pip).value;
      pNVar5 = pNVar5 + 1;
    }
  }
  else {
    for (; pNVar7 != pNVar10; pNVar7 = pNVar7 + 1) {
      ctx = (EVP_PKEY_CTX *)(pNVar7->pip).value;
      (pNVar5->pip).value = (uintptr_t)ctx;
      pNVar5 = pNVar5 + 1;
    }
    puVar6 = (uintptr_t *)(lVar9 + (long)pNVar4);
    for (; puVar6 = puVar6 + 1, pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
      *puVar6 = (pNVar10->pip).value;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pNVar4;
  return (reference)((long)pNVar4 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }